

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O0

MessageProcessingResult __thiscall
helics::GlobalTimeCoordinator::checkExecEntry(GlobalTimeCoordinator *this,GlobalFederateId param_2)

{
  bool bVar1;
  reference pDVar2;
  char *in_RDI;
  ActionMessage execgrant;
  DependencyInfo *dep;
  iterator __end3;
  iterator __begin3;
  TimeDependencies *__range3;
  bool allowed;
  MessageProcessingResult ret;
  ActionMessage logcmd;
  ActionMessage *in_stack_fffffffffffffe18;
  ActionMessage *in_stack_fffffffffffffe20;
  ActionMessage *this_00;
  undefined4 in_stack_fffffffffffffe30;
  GlobalFederateId in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  action_t in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe44;
  string_view in_stack_fffffffffffffe48;
  bool in_stack_fffffffffffffe66;
  bool in_stack_fffffffffffffe67;
  TimeDependencies *in_stack_fffffffffffffe68;
  ActionMessage *in_stack_fffffffffffffe70;
  GlobalTimeCoordinator *in_stack_fffffffffffffe78;
  GlobalFederateId in_stack_fffffffffffffe84;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_f8;
  char *local_f0;
  byte local_e6;
  MessageProcessingResult local_e5;
  ActionMessage local_c8;
  MessageProcessingResult local_1;
  
  if ((in_RDI[0x52] & 1U) == 0) {
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffe20);
    if (bVar1) {
      this_00 = &local_c8;
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe3c);
      local_c8.messageID = 3;
      local_c8.dest_id.gid = *(BaseType *)(in_RDI + 0x48);
      local_c8.source_id.gid = *(BaseType *)(in_RDI + 0x48);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe34.gid,in_stack_fffffffffffffe30),in_RDI);
      ActionMessage::setString
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe3c,in_stack_fffffffffffffe48);
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                ((function<void_(const_helics::ActionMessage_&)> *)this_00,in_stack_fffffffffffffe18
                );
      ActionMessage::~ActionMessage(this_00);
    }
    local_1 = CONTINUE_PROCESSING;
  }
  else {
    local_e5 = CONTINUE_PROCESSING;
    bVar1 = TimeDependencies::checkIfReadyForExecEntry
                      (in_stack_fffffffffffffe68,in_stack_fffffffffffffe67,in_stack_fffffffffffffe66
                      );
    if (!bVar1) {
      local_e6 = 0;
      if (in_RDI[0x60] == '\x02') {
        local_e6 = 1;
        local_f0 = in_RDI + 8;
        local_f8._M_current =
             (DependencyInfo *)
             TimeDependencies::begin((TimeDependencies *)in_stack_fffffffffffffe18);
        TimeDependencies::end((TimeDependencies *)in_stack_fffffffffffffe18);
        while (bVar1 = __gnu_cxx::
                       operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                   *)in_stack_fffffffffffffe20,
                                  (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                   *)in_stack_fffffffffffffe18), ((bVar1 ^ 0xffU) & 1) != 0) {
          pDVar2 = __gnu_cxx::
                   __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                   ::operator*(&local_f8);
          if ((pDVar2->dependency & 1U) != 0) {
            bVar1 = GlobalFederateId::operator!=
                              (&(pDVar2->super_TimeData).minFed,
                               (GlobalFederateId)*(BaseType *)(in_RDI + 0x48));
            if (bVar1) {
              local_e6 = 0;
              break;
            }
            if ((pDVar2->super_TimeData).responseSequenceCounter != *(int *)(in_RDI + 0x4c)) {
              local_e6 = 0;
              break;
            }
          }
          __gnu_cxx::
          __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
          ::operator++(&local_f8);
        }
      }
      if ((local_e6 & 1) == 0) {
        return local_e5;
      }
    }
    in_RDI[0x53] = '\x01';
    local_e5 = NEXT_STEP;
    in_RDI[0x58] = '\0';
    in_RDI[0x59] = '\0';
    in_RDI[0x5a] = '\0';
    in_RDI[0x5b] = '\0';
    in_RDI[0x5c] = '\0';
    in_RDI[0x5d] = '\0';
    in_RDI[0x5e] = '\0';
    in_RDI[0x5f] = '\0';
    in_RDI[0x60] = '\x05';
    in_RDI[0x68] = '\0';
    in_RDI[0x69] = '\0';
    in_RDI[0x6a] = '\0';
    in_RDI[0x6b] = '\0';
    in_RDI[0x6c] = '\0';
    in_RDI[0x6d] = '\0';
    in_RDI[0x6e] = '\0';
    in_RDI[0x6f] = '\0';
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe3c);
    uVar3 = *(undefined4 *)(in_RDI + 0x48);
    GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xfffffffffffffe34);
    transmitTimingMessagesDownstream
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe84);
    transmitTimingMessagesUpstream
              ((GlobalTimeCoordinator *)CONCAT44(in_stack_fffffffffffffe44,uVar3),
               (ActionMessage *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    local_1 = local_e5;
    ActionMessage::~ActionMessage(in_stack_fffffffffffffe20);
  }
  return local_1;
}

Assistant:

MessageProcessingResult GlobalTimeCoordinator::checkExecEntry(GlobalFederateId /*triggerFed*/)
{
    if (!checkingExec) {
        if (sendMessageFunction) {
            ActionMessage logcmd(CMD_LOG);
            logcmd.messageID = HELICS_LOG_LEVEL_WARNING;
            logcmd.dest_id = mSourceId;
            logcmd.source_id = mSourceId;
            logcmd.setString(
                0, "calling checkExecEntry without first calling enterExec this is probably a bug");
            sendMessageFunction(logcmd);
        }
        return MessageProcessingResult::CONTINUE_PROCESSING;
    }
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    if (!dependencies.checkIfReadyForExecEntry(false, false)) {
        bool allowed{false};
        if (currentTimeState == TimeState::exec_requested_iterative) {
            allowed = true;
            for (const auto& dep : dependencies) {
                if (dep.dependency) {
                    if (dep.minFed != mSourceId) {
                        allowed = false;
                        break;
                    }
                    if (dep.responseSequenceCounter != sequenceCounter) {
                        allowed = false;
                        break;
                    }
                }
            }
        }
        if (!allowed) {
            return ret;
        }
    }
    executionMode = true;
    ret = MessageProcessingResult::NEXT_STEP;

    currentMinTime = timeZero;
    currentTimeState = TimeState::time_granted;
    nextEvent = timeZero;

    ActionMessage execgrant(CMD_EXEC_GRANT);
    execgrant.source_id = mSourceId;
    transmitTimingMessagesDownstream(execgrant);
    transmitTimingMessagesUpstream(execgrant);
    return ret;
}